

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O2

size_t hex2binary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  strfirst,
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 strlast,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         first,
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  i;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var6;
  
  uVar5 = 0;
  iVar4 = 0;
  _Var6._M_current = first._M_current;
  while ((strfirst._M_current != strlast._M_current && (_Var6._M_current != last._M_current))) {
    uVar1 = char2nyble<char>(*strfirst._M_current);
    if (uVar1 < 0x10) {
      bVar2 = (char)uVar5 << 4 | (byte)uVar1;
      iVar3 = iVar4 + 4;
      uVar5 = (uint)bVar2;
      if (iVar4 == 0) {
        uVar5 = uVar1;
      }
      iVar4 = iVar3;
      if (iVar3 == 8) {
        *_Var6._M_current = bVar2;
        _Var6._M_current = _Var6._M_current + 1;
        iVar4 = 0;
      }
    }
    strfirst._M_current = strfirst._M_current + 1;
  }
  return (long)_Var6._M_current - (long)first._M_current;
}

Assistant:

size_t hex2binary(P1 strfirst, P1 strlast, P2 first, P2 last)
{
    int shift=0;
    typename std::iterator_traits<P2>::value_type word=0;
    P2 o= first;
    for (P1 i= strfirst ; i!=strlast && o!=last ; i++)
    {
        int n= char2nyble(*i);
        if (n>=0 && n<16) {
            if (shift==0) {
                word= typename std::iterator_traits<P2>::value_type(n);
                shift+=4;
            }
            else {
                word<<=4;
                word|= n;
                shift+=4;
            }
            if (shift==sizeof(word)*8) {
                *o++= word;

                shift=0;
            }
        }
    }
    return o-first;
}